

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_util_tests(void)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t s;
  uint64_t r3;
  uint64_t r2;
  uint64_t r;
  int i;
  uint64_t in_stack_ffffffffffffffd8;
  ulong local_18;
  ulong local_10;
  int local_4;
  
  iVar1 = secp256k1_clz64_var(0);
  if (iVar1 != 0x40) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xbe,"test condition failed: secp256k1_clz64_var(0) == 64");
    abort();
  }
  iVar1 = secp256k1_clz64_var(1);
  if (iVar1 != 0x3f) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xbf,"test condition failed: secp256k1_clz64_var(1) == 63");
    abort();
  }
  iVar1 = secp256k1_clz64_var(2);
  if (iVar1 != 0x3e) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc0,"test condition failed: secp256k1_clz64_var(2) == 62");
    abort();
  }
  iVar1 = secp256k1_clz64_var(3);
  if (iVar1 != 0x3e) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc1,"test condition failed: secp256k1_clz64_var(3) == 62");
    abort();
  }
  iVar1 = secp256k1_clz64_var(0xffffffffffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc2,"test condition failed: secp256k1_clz64_var(~0ULL) == 0");
    abort();
  }
  iVar1 = secp256k1_clz64_var(0xfffffffffffffffe);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc3,"test condition failed: secp256k1_clz64_var((~0ULL) - 1) == 0");
    abort();
  }
  iVar1 = secp256k1_clz64_var(0x7fffffffffffffff);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc4,"test condition failed: secp256k1_clz64_var((~0ULL) >> 1) == 1");
    abort();
  }
  iVar1 = secp256k1_clz64_var(0x3fffffffffffffff);
  if (iVar1 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc5,"test condition failed: secp256k1_clz64_var((~0ULL) >> 2) == 2");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,0x7fffffffffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc6,"test condition failed: secp256k1_sign_and_abs64(&r, INT64_MAX) == 0");
    abort();
  }
  if (local_10 != 0x7fffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,199,"test condition failed: r == INT64_MAX");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,0x7ffffffffffffffe);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,200,"test condition failed: secp256k1_sign_and_abs64(&r, INT64_MAX - 1) == 0");
    abort();
  }
  if (local_10 != 0x7ffffffffffffffe) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc9,"test condition failed: r == INT64_MAX - 1");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,-0x8000000000000000);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xca,"test condition failed: secp256k1_sign_and_abs64(&r, INT64_MIN) == 1");
    abort();
  }
  if (local_10 != 0x8000000000000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xcb,"test condition failed: r == (uint64_t)INT64_MAX + 1");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,-0x7fffffffffffffff);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xcc,"test condition failed: secp256k1_sign_and_abs64(&r, INT64_MIN + 1) == 1");
    abort();
  }
  if (local_10 != 0x7fffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xcd,"test condition failed: r == (uint64_t)INT64_MAX");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xce,"test condition failed: secp256k1_sign_and_abs64(&r, 0) == 0");
    abort();
  }
  if (local_10 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xcf,"test condition failed: r == 0");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd0,"test condition failed: secp256k1_sign_and_abs64(&r, 1) == 0");
    abort();
  }
  if (local_10 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd1,"test condition failed: r == 1");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,-1);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd2,"test condition failed: secp256k1_sign_and_abs64(&r, -1) == 1");
    abort();
  }
  if (local_10 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd3,"test condition failed: r == 1");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,2);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd4,"test condition failed: secp256k1_sign_and_abs64(&r, 2) == 0");
    abort();
  }
  if (local_10 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd5,"test condition failed: r == 2");
    abort();
  }
  iVar1 = secp256k1_sign_and_abs64(&local_10,-2);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd6,"test condition failed: secp256k1_sign_and_abs64(&r, -2) == 1");
    abort();
  }
  if (local_10 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xd7,"test condition failed: r == 2");
    abort();
  }
  local_4 = 0;
  while( true ) {
    if (9 < local_4) {
      return;
    }
    uVar2 = secp256k1_testrand32();
    iVar1 = secp256k1_clz64_var(-(ulong)uVar2 - 1);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xd9,
              "test condition failed: secp256k1_clz64_var((~0ULL) - secp256k1_testrand32()) == 0");
      abort();
    }
    uVar2 = secp256k1_testrand32();
    uVar4 = (ulong)uVar2 << 0x20;
    uVar2 = secp256k1_testrand32();
    local_10 = uVar4 | uVar2;
    local_18 = secp256k1_testrandi64(in_stack_ffffffffffffffd8,uVar4);
    if (local_10 < local_18) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xdc,"test condition failed: r2 <= r");
      abort();
    }
    uVar5 = secp256k1_testrandi64(in_stack_ffffffffffffffd8,uVar4);
    if (uVar5 < local_18 || local_10 < uVar5) break;
    uVar4 = secp256k1_testrandi64(in_stack_ffffffffffffffd8,uVar4);
    local_10 = uVar4;
    uVar2 = secp256k1_testrand32();
    iVar1 = 1;
    if ((uVar2 & 1) != 0) {
      iVar1 = -1;
    }
    in_stack_ffffffffffffffd8 = uVar4 * (long)iVar1;
    uVar3 = secp256k1_sign_and_abs64(&local_18,in_stack_ffffffffffffffd8);
    if (uVar3 != (long)in_stack_ffffffffffffffd8 < 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xe1,"test condition failed: secp256k1_sign_and_abs64(&r2, s) == (s < 0)");
      abort();
    }
    if (local_18 != local_10) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xe2,"test condition failed: r2 == r");
      abort();
    }
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0xde,"test condition failed: (r3 >= r2) && (r3 <= r)");
  abort();
}

Assistant:

static void run_util_tests(void) {
    int i;
    uint64_t r;
    uint64_t r2;
    uint64_t r3;
    int64_t s;
    CHECK(secp256k1_clz64_var(0) == 64);
    CHECK(secp256k1_clz64_var(1) == 63);
    CHECK(secp256k1_clz64_var(2) == 62);
    CHECK(secp256k1_clz64_var(3) == 62);
    CHECK(secp256k1_clz64_var(~0ULL) == 0);
    CHECK(secp256k1_clz64_var((~0ULL) - 1) == 0);
    CHECK(secp256k1_clz64_var((~0ULL) >> 1) == 1);
    CHECK(secp256k1_clz64_var((~0ULL) >> 2) == 2);
    CHECK(secp256k1_sign_and_abs64(&r, INT64_MAX) == 0);
    CHECK(r == INT64_MAX);
    CHECK(secp256k1_sign_and_abs64(&r, INT64_MAX - 1) == 0);
    CHECK(r == INT64_MAX - 1);
    CHECK(secp256k1_sign_and_abs64(&r, INT64_MIN) == 1);
    CHECK(r == (uint64_t)INT64_MAX + 1);
    CHECK(secp256k1_sign_and_abs64(&r, INT64_MIN + 1) == 1);
    CHECK(r == (uint64_t)INT64_MAX);
    CHECK(secp256k1_sign_and_abs64(&r, 0) == 0);
    CHECK(r == 0);
    CHECK(secp256k1_sign_and_abs64(&r, 1) == 0);
    CHECK(r == 1);
    CHECK(secp256k1_sign_and_abs64(&r, -1) == 1);
    CHECK(r == 1);
    CHECK(secp256k1_sign_and_abs64(&r, 2) == 0);
    CHECK(r == 2);
    CHECK(secp256k1_sign_and_abs64(&r, -2) == 1);
    CHECK(r == 2);
    for (i = 0; i < 10; i++) {
        CHECK(secp256k1_clz64_var((~0ULL) - secp256k1_testrand32()) == 0);
        r = ((uint64_t)secp256k1_testrand32() << 32) | secp256k1_testrand32();
        r2 = secp256k1_testrandi64(0, r);
        CHECK(r2 <= r);
        r3 = secp256k1_testrandi64(r2, r);
        CHECK((r3 >= r2) && (r3 <= r));
        r = secp256k1_testrandi64(0, INT64_MAX);
        s = (int64_t)r * (secp256k1_testrand32()&1?-1:1);
        CHECK(secp256k1_sign_and_abs64(&r2, s) == (s < 0));
        CHECK(r2 == r);
    }
}